

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O3

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::
ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>>
::construct<unsigned_int_const&,double_const&,double_const&>
          (ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>>
           *this,uint *args,double *args_1,double *args_2)

{
  double dVar1;
  double dVar2;
  iterator __position;
  Node *pNVar3;
  ulong uVar4;
  
  uVar4 = *(ulong *)(this + 8);
  if (*(ulong *)(this + 0x10) <= uVar4) {
    pNVar3 = __gnu_cxx::new_allocator<mapbox::detail::Earcut<unsigned_int>::Node>::allocate
                       ((new_allocator<mapbox::detail::Earcut<unsigned_int>::Node> *)(this + 0x30),
                        *(ulong *)(this + 0x10),(void *)0x0);
    *(Node **)this = pNVar3;
    __position._M_current = *(Node ***)(this + 0x20);
    if (__position._M_current == *(Node ***)(this + 0x28)) {
      std::
      vector<mapbox::detail::Earcut<unsigned_int>::Node*,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node*>>
      ::_M_realloc_insert<mapbox::detail::Earcut<unsigned_int>::Node*&>
                ((vector<mapbox::detail::Earcut<unsigned_int>::Node*,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node*>>
                  *)(this + 0x18),__position,(Node **)this);
    }
    else {
      *__position._M_current = pNVar3;
      *(long *)(this + 0x20) = *(long *)(this + 0x20) + 8;
    }
    uVar4 = 0;
  }
  *(ulong *)(this + 8) = uVar4 + 1;
  pNVar3 = (Node *)(*(long *)this + uVar4 * 0x48);
  dVar1 = *args_1;
  dVar2 = *args_2;
  pNVar3->i = *args;
  pNVar3->x = dVar1;
  pNVar3->y = dVar2;
  pNVar3->prev = (Node *)0x0;
  pNVar3->next = (Node *)0x0;
  pNVar3->z = 0;
  pNVar3->prevZ = (Node *)0x0;
  pNVar3->nextZ = (Node *)0x0;
  pNVar3->steiner = false;
  return pNVar3;
}

Assistant:

T* construct(Args&&... args) {
            if (currentIndex >= blockSize) {
                currentBlock = alloc_traits::allocate(alloc, blockSize);
                allocations.emplace_back(currentBlock);
                currentIndex = 0;
            }
            T* object = &currentBlock[currentIndex++];
            alloc_traits::construct(alloc, object, std::forward<Args>(args)...);
            return object;
        }